

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O0

bool __thiscall Date::is_valid(Date *this)

{
  bool bVar1;
  bool local_23;
  bool local_22;
  bool local_21;
  bool is_valid;
  Date *this_local;
  
  bVar1 = false;
  if (((0 < this->y) && (bVar1 = false, 0 < (int)this->m)) && (bVar1 = false, (int)this->m < 0xd)) {
    bVar1 = 0 < this->d;
  }
  local_21 = false;
  if (bVar1) {
    bVar1 = is_31_day_month(this->m);
    if (((!bVar1) || (local_22 = true, 0x1f < this->d)) &&
       ((bVar1 = is_30_day_month(this->m), !bVar1 || (local_22 = true, 0x1e < this->d)))) {
      if (((this->m != feb) || (bVar1 = is_leap(this->y), !bVar1)) ||
         (local_23 = true, 0x1d < this->d)) {
        local_23 = this->d < 0x1d;
      }
      local_22 = local_23;
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool Date::is_valid()
{
	bool is_valid = y > 0 && (int(m) > 0 && int(m) < 13) && d > 0;
	is_valid = is_valid && (
		(is_31_day_month(m) && d < 32) ||
		(is_30_day_month(m) && d < 31) ||
		(m == Month::feb && (is_leap(y) && d < 30) || d < 29)
		);
	return is_valid;
}